

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

weight * __thiscall sparse_parameters::operator[](sparse_parameters *this,size_t i)

{
  bool bVar1;
  pointer ppVar2;
  ulong in_RSI;
  sparse_parameters *in_RDI;
  iterator iter;
  uint64_t index;
  size_t in_stack_00000168;
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  *in_stack_ffffffffffffff98;
  _func_void_weight_ptr_void_ptr *p_Var3;
  pair<unsigned_long,_float_*> *in_stack_ffffffffffffffa8;
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_20;
  ulong local_18;
  
  local_18 = in_RSI & in_RDI->_weight_mask;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x167390);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    stride(in_RDI);
    calloc_or_throw<float>(in_stack_00000168);
    std::make_pair<unsigned_long&,float*>
              ((unsigned_long *)in_RDI,(float **)in_stack_ffffffffffffff98);
    std::
    unordered_map<unsigned_long,float*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,float*>>>
    ::insert<std::pair<unsigned_long,float*>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
         ::find(in_stack_ffffffffffffff98,(key_type *)0x167414);
    if (in_RDI->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
      p_Var3 = in_RDI->fun;
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> *
                            )0x167449);
      (*p_Var3)(ppVar2->second,in_RDI->default_data);
    }
  }
  ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> *)
                      0x16746b);
  return ppVar2->second;
}

Assistant:

inline weight& operator[](size_t i)
  {
    uint64_t index = i & _weight_mask;
    weight_map::iterator iter = _map.find(index);
    if (iter == _map.end())
    {
      _map.insert(std::make_pair(index, calloc_mergable_or_throw<weight>(stride())));
      iter = _map.find(index);
      if (fun != nullptr)
        fun(iter->second, default_data);
    }
    return *(iter->second);
  }